

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  Impl *pIVar1;
  EntryImpl *this_00;
  Directory *__fn;
  WriteMode mode;
  void *__child_stack;
  void *in_R8;
  Own<const_kj::Directory> local_70;
  ArrayPtr<const_char> local_60;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> local_50;
  EntryImpl *local_48;
  EntryImpl *entry;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_20;
  Fault f;
  ReplacerImpl<kj::Directory> *this_local;
  
  f.exception = (Exception *)this;
  if ((((this->super_Replacer<kj::Directory>).field_0xc ^ 0xff) & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x580,FAILED,"!committed","\"commit() already called\"",
               (char (*) [24])"commit() already called");
    this_local._7_1_ = true;
    _::Debug::Fault::~Fault(&local_20);
  }
  else {
    Own<const_kj::(anonymous_namespace)::InMemoryDirectory>::operator->(&this->directory);
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
    StringPtr::StringPtr((StringPtr *)&local_60,&this->name);
    mode = (this->super_Replacer<kj::Directory>).mode;
    local_50 = InMemoryDirectory::Impl::openEntry(pIVar1,(StringPtr)local_60,mode);
    this_00 = _::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>(&local_50);
    this_local._7_1_ = this_00 != (EntryImpl *)0x0;
    local_48 = this_00;
    if (this_local._7_1_) {
      __fn = Own<const_kj::Directory>::operator->(&this->inner);
      Directory::clone((Directory *)&local_70,(__fn *)__fn,__child_stack,mode,in_R8);
      EntryImpl::set(this_00,&local_70);
      Own<const_kj::Directory>::~Own(&local_70);
      pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      InMemoryDirectory::Impl::modified(pIVar1);
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
  }
  return this_local._7_1_;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry->set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }